

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rust_field_type.cc
# Opt level: O0

RustFieldType google::protobuf::compiler::rust::GetRustFieldType(Type type)

{
  LogMessage *pLVar1;
  LogMessage local_28 [23];
  Voidify local_11;
  Type local_10;
  RustFieldType local_c;
  Type type_local;
  
  switch(type) {
  case TYPE_DOUBLE:
    local_c = DOUBLE;
    break;
  case TYPE_FLOAT:
    local_c = FLOAT;
    break;
  case TYPE_INT64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    local_c = INT64;
    break;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    local_c = UINT64;
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    local_c = INT32;
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    local_c = UINT32;
    break;
  case TYPE_BOOL:
    local_c = BOOL;
    break;
  case TYPE_STRING:
    local_c = STRING;
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    local_c = MESSAGE;
    break;
  case TYPE_BYTES:
    local_c = BYTES;
    break;
  case TYPE_ENUM:
    local_c = ENUM;
    break;
  default:
    local_10 = type;
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/rust_field_type.cc"
               ,0x30);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream(local_28);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [21])"Unknown field type: ");
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::
             operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>(pLVar1,&local_10);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar1);
    absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_28);
    protobuf::internal::Unreachable
              ("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/rust_field_type.cc"
               ,0x31);
  }
  return local_c;
}

Assistant:

RustFieldType GetRustFieldType(FieldDescriptor::Type type) {
  switch (type) {
    case FieldDescriptor::TYPE_BOOL:
      return RustFieldType::BOOL;
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SFIXED32:
      return RustFieldType::INT32;
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_SFIXED64:
      return RustFieldType::INT64;
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32:
      return RustFieldType::UINT32;
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64:
      return RustFieldType::UINT64;
    case FieldDescriptor::TYPE_FLOAT:
      return RustFieldType::FLOAT;
    case FieldDescriptor::TYPE_DOUBLE:
      return RustFieldType::DOUBLE;
    case FieldDescriptor::TYPE_BYTES:
      return RustFieldType::BYTES;
    case FieldDescriptor::TYPE_STRING:
      return RustFieldType::STRING;
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return RustFieldType::MESSAGE;
    case FieldDescriptor::TYPE_ENUM:
      return RustFieldType::ENUM;
  }
  ABSL_LOG(ERROR) << "Unknown field type: " << type;
  internal::Unreachable();
}